

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_release(ikcpcb *kcp)

{
  IKCPSEG *pIVar1;
  IKCPSEG *seg;
  ikcpcb *kcp_local;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x12f,"void ikcp_release(ikcpcb *)");
  }
  if (kcp != (ikcpcb *)0x0) {
    while (&kcp->snd_buf != (kcp->snd_buf).next) {
      pIVar1 = (IKCPSEG *)(kcp->snd_buf).next;
      ((pIVar1->node).next)->prev = (pIVar1->node).prev;
      ((pIVar1->node).prev)->next = (pIVar1->node).next;
      (pIVar1->node).next = (IQUEUEHEAD *)0x0;
      (pIVar1->node).prev = (IQUEUEHEAD *)0x0;
      ikcp_segment_delete(kcp,pIVar1);
    }
    while (&kcp->rcv_buf != (kcp->rcv_buf).next) {
      pIVar1 = (IKCPSEG *)(kcp->rcv_buf).next;
      ((pIVar1->node).next)->prev = (pIVar1->node).prev;
      ((pIVar1->node).prev)->next = (pIVar1->node).next;
      (pIVar1->node).next = (IQUEUEHEAD *)0x0;
      (pIVar1->node).prev = (IQUEUEHEAD *)0x0;
      ikcp_segment_delete(kcp,pIVar1);
    }
    while (&kcp->snd_queue != (kcp->snd_queue).next) {
      pIVar1 = (IKCPSEG *)(kcp->snd_queue).next;
      ((pIVar1->node).next)->prev = (pIVar1->node).prev;
      ((pIVar1->node).prev)->next = (pIVar1->node).next;
      (pIVar1->node).next = (IQUEUEHEAD *)0x0;
      (pIVar1->node).prev = (IQUEUEHEAD *)0x0;
      ikcp_segment_delete(kcp,pIVar1);
    }
    while (&kcp->rcv_queue != (kcp->rcv_queue).next) {
      pIVar1 = (IKCPSEG *)(kcp->rcv_queue).next;
      ((pIVar1->node).next)->prev = (pIVar1->node).prev;
      ((pIVar1->node).prev)->next = (pIVar1->node).next;
      (pIVar1->node).next = (IQUEUEHEAD *)0x0;
      (pIVar1->node).prev = (IQUEUEHEAD *)0x0;
      ikcp_segment_delete(kcp,pIVar1);
    }
    if (kcp->buffer != (char *)0x0) {
      ikcp_free(kcp->buffer);
    }
    if (kcp->acklist != (IUINT32 *)0x0) {
      ikcp_free(kcp->acklist);
    }
    kcp->nrcv_buf = 0;
    kcp->nsnd_buf = 0;
    kcp->nrcv_que = 0;
    kcp->nsnd_que = 0;
    kcp->ackcount = 0;
    kcp->buffer = (char *)0x0;
    kcp->acklist = (IUINT32 *)0x0;
    ikcp_free(kcp);
  }
  return;
}

Assistant:

void ikcp_release(ikcpcb *kcp)
{
	assert(kcp);
	if (kcp) {
		IKCPSEG *seg;
		while (!iqueue_is_empty(&kcp->snd_buf)) {
			seg = iqueue_entry(kcp->snd_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_buf)) {
			seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->snd_queue)) {
			seg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		while (!iqueue_is_empty(&kcp->rcv_queue)) {
			seg = iqueue_entry(kcp->rcv_queue.next, IKCPSEG, node);
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
		}
		if (kcp->buffer) {
			ikcp_free(kcp->buffer);
		}
		if (kcp->acklist) {
			ikcp_free(kcp->acklist);
		}

		kcp->nrcv_buf = 0;
		kcp->nsnd_buf = 0;
		kcp->nrcv_que = 0;
		kcp->nsnd_que = 0;
		kcp->ackcount = 0;
		kcp->buffer = NULL;
		kcp->acklist = NULL;
		ikcp_free(kcp);
	}
}